

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O2

void __thiscall R::R(R *this,Object *obj)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var2;
  R local_40;
  string local_38;
  
  local_40.object = obj;
  std::__cxx11::to_string(&local_38,obj->referencesNum + 1);
  SysLog::debug<char[25],Object*,char[17],std::__cxx11::string>
            (&GC::logger,(char (*) [25])"NEW Reference of object ",&local_40.object,
             (char (*) [17])" Reference num: ",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->object = (Object *)local_40;
  (local_40.object)->referencesNum = (local_40.object)->referencesNum + 1;
  iVar1 = (*(local_40.object)->_vptr_Object[2])();
  if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x28) != 0) {
    iVar1 = (*this->object->_vptr_Object[2])();
    for (p_Var2 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var_00,iVar1) + 0x18);
        p_Var2 != (_Rb_tree_node_base *)(CONCAT44(extraout_var_00,iVar1) + 8);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      *(int *)(*(long *)(p_Var2 + 1) + 8) = *(int *)(*(long *)(p_Var2 + 1) + 8) + 1;
    }
  }
  return;
}

Assistant:

R::R(Object* obj) {
	GC::logger.debug("NEW Reference of object ", obj, " Reference num: ", to_string(obj->referencesNum + 1));
	this->object = obj;
	this->object->referencesNum++;
	if (!this->object->getDepends().empty()) {
        for (auto dep : this->object->getDepends()) {
            dep->referencesNum++;
        }
	}
}